

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

bool __thiscall
el::Configurations::parseFromFile
          (Configurations *this,string *configurationFile,Configurations *base)

{
  char *__file;
  int iVar1;
  ostream *poVar2;
  bool bVar3;
  stat st;
  char *local_1d0;
  long local_1c8;
  char local_1c0 [16];
  undefined1 local_1b0 [128];
  ios_base local_130 [264];
  
  __file = (configurationFile->_M_dataplus)._M_p;
  if (__file == (char *)0x0) {
    bVar3 = false;
  }
  else {
    iVar1 = stat(__file,(stat *)local_1b0);
    bVar3 = iVar1 == 0;
  }
  if (bVar3) {
    bVar3 = Parser::parseFromFile(configurationFile,this,base);
    this->m_isFromFile = bVar3;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x10),"Configuration file [",0x14);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_1b0 + 0x10),(configurationFile->_M_dataplus)._M_p,
                        configurationFile->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] does not exist!",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,0xd5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               ") [(assertionPassed = base::utils::File::pathExists(configurationFile.c_str(), true)) == true"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] WITH MESSAGE \"",0x10);
    std::__cxx11::stringbuf::str();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1d0,local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Configurations::parseFromFile(const std::string& configurationFile, Configurations* base) {
  // We initial assertion with true because if we have assertion diabled, we want to pass this
  // check and if assertion is enabled we will have values re-assigned any way.
  bool assertionPassed = true;
  ELPP_ASSERT((assertionPassed = base::utils::File::pathExists(configurationFile.c_str(), true)) == true,
              "Configuration file [" << configurationFile << "] does not exist!");
  if (!assertionPassed) {
    return false;
  }
  bool success = Parser::parseFromFile(configurationFile, this, base);
  m_isFromFile = success;
  return success;
}